

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     resize_if_allowed<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,float,float>
               (Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dst,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *src,
               assign_op<float,_float> *param_3)

{
  Index IVar1;
  Index cols;
  Index IVar2;
  bool bVar3;
  Index dstCols;
  Index dstRows;
  assign_op<float,_float> *param_2_local;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *src_local;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *dst_local;
  
  IVar1 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      *)src);
  cols = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::cols
                   ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                     *)src);
  IVar2 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      *)dst);
  if (IVar2 == IVar1) {
    IVar2 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::cols
                      ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                        *)dst);
    if (IVar2 == cols) goto LAB_0024a84d;
  }
  DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::resize
            ((DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)dst,
             IVar1,cols);
LAB_0024a84d:
  IVar2 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::rows
                    ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      *)dst);
  bVar3 = false;
  if (IVar2 == IVar1) {
    IVar1 = MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>::cols
                      ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                        *)dst);
    bVar3 = IVar1 == cols;
  }
  if (!bVar3) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                  ,0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, SrcXprType = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>, T1 = float, T2 = float]"
                 );
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void resize_if_allowed(DstXprType &dst, const SrcXprType& src, const internal::assign_op<T1,T2> &/*func*/)
{
  Index dstRows = src.rows();
  Index dstCols = src.cols();
  if(((dst.rows()!=dstRows) || (dst.cols()!=dstCols)))
    dst.resize(dstRows, dstCols);
  eigen_assert(dst.rows() == dstRows && dst.cols() == dstCols);
}